

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lauxlib.c
# Opt level: O1

char * luaL_prepbuffsize(luaL_Buffer *B,size_t sz)

{
  ulong uVar1;
  lua_State *L;
  ulong uVar2;
  char *__dest;
  ulong size;
  
  uVar1 = B->n;
  if (B->size - uVar1 < sz) {
    uVar2 = B->size * 2;
    size = uVar1 + sz;
    if (sz <= uVar2 - uVar1) {
      size = uVar2;
    }
    L = B->L;
    if (!(bool)(~(size < uVar1) & sz <= size - uVar1)) {
      luaL_error(L,"buffer too large");
    }
    __dest = (char *)lua_newuserdata(L,size);
    memcpy(__dest,B->b,B->n);
    if (B->b != B->initb) {
      lua_remove(L,-2);
    }
    B->b = __dest;
    B->size = size;
  }
  return B->b + B->n;
}

Assistant:

LUALIB_API char *luaL_prepbuffsize (luaL_Buffer *B, size_t sz) {
  lua_State *L = B->L;
  if (B->size - B->n < sz) {  /* not enough space? */
    char *newbuff;
    size_t newsize = B->size * 2;  /* double buffer size */
    if (newsize - B->n < sz)  /* not big enough? */
      newsize = B->n + sz;
    if (newsize < B->n || newsize - B->n < sz)
      luaL_error(L, "buffer too large");
    /* create larger buffer */
    newbuff = (char *)lua_newuserdata(L, newsize * sizeof(char));
    /* move content to new buffer */
    memcpy(newbuff, B->b, B->n * sizeof(char));
    if (buffonstack(B))
      lua_remove(L, -2);  /* remove old buffer */
    B->b = newbuff;
    B->size = newsize;
  }
  return &B->b[B->n];
}